

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O3

SectionHdrWrapper * __thiscall
PEFile::addNewSection(PEFile *this,QString *name,bufsize_t r_size,bufsize_t v_size)

{
  AbstractByteBuffer AVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bufsize_t bVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar6;
  ulong uVar7;
  long lVar8;
  SectionHdrWrapper *pSVar9;
  size_t __n;
  IMAGE_SECTION_HEADER secHdr;
  WatchedLocker lock;
  WatchedLocker lock_1;
  QString local_128;
  bufsize_t local_110;
  IMAGE_SECTION_HEADER local_108;
  SectionHdrWrapper local_e0;
  
  if (v_size == 0 && r_size == 0) {
    return (SectionHdrWrapper *)0x0;
  }
  WatchedLocker::WatchedLocker((WatchedLocker *)&local_e0,&this->m_peMutex,false,"addNewSection");
  bVar2 = _canAddNewSection(this);
  if (bVar2) {
    if (v_size == 0) {
      v_size = r_size;
    }
    iVar3 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[0xf])(this,1);
    iVar4 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[0x10])(this,1);
    bVar5 = buf_util::roundupToUnit(CONCAT44(extraout_var,iVar3),CONCAT44(extraout_var_00,iVar4));
    iVar3 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[0xf])(this,2);
    iVar4 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[0x10])(this,2);
    local_110 = buf_util::roundupToUnit
                          (CONCAT44(extraout_var_01,iVar3),CONCAT44(extraout_var_02,iVar4));
    lVar8 = local_110 + v_size;
    iVar3 = (*(this->optHdr->super_PEElementWrapper).super_ExeElementWrapper.
              super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1d])
                      (this->optHdr,0x13,0xffffffffffffffff,lVar8);
    if ((char)iVar3 != '\0') {
      WatchedLocker::~WatchedLocker((WatchedLocker *)&local_e0);
      iVar3 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[10])(this,bVar5 + r_size);
      if ((char)iVar3 == '\0') {
        Logger::append(D_ERROR,"Failed to resize");
        return (SectionHdrWrapper *)0x0;
      }
      WatchedLocker::WatchedLocker
                ((WatchedLocker *)&stack0xffffffffffffff98,&this->m_peMutex,false,"addNewSection");
      iVar3 = (*(this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer[2])
                        (&(this->super_MappedExe).super_ExeWrappersContainer,5);
      if ((CONCAT44(extraout_var_03,iVar3) != 0) &&
         (plVar6 = (long *)__dynamic_cast(CONCAT44(extraout_var_03,iVar3),
                                          &ExeElementWrapper::typeinfo,&ExeNodeWrapper::typeinfo,0),
         plVar6 != (long *)0x0)) {
        local_108.SizeOfRawData = 0;
        local_108.PointerToRawData = 0;
        local_108.PointerToRelocations = 0;
        local_108.PointerToLinenumbers = 0;
        local_108.Name[0] = '\0';
        local_108.Name[1] = '\0';
        local_108.Name[2] = '\0';
        local_108.Name[3] = '\0';
        local_108.Name[4] = '\0';
        local_108.Name[5] = '\0';
        local_108.Name[6] = '\0';
        local_108.Name[7] = '\0';
        local_108.Misc = (anon_union_4_2_d8da8690_for_Misc)0x0;
        local_108.VirtualAddress = 0;
        local_108.NumberOfRelocations = 0;
        local_108.NumberOfLinenumbers = 0;
        local_108.Characteristics = 0;
        uVar7 = (name->d).size;
        __n = 8;
        if (uVar7 < 8) {
          __n = uVar7;
        }
        if (uVar7 != 0) {
          QString::toUtf8_helper(&local_128);
          if (local_128.d.ptr == (char16_t *)0x0) {
            local_128.d.ptr = (char16_t *)&QByteArray::_empty;
          }
          local_e0.super_PENodeWrapper.super_ExeNodeWrapper.super_ExeElementWrapper.
          super_AbstractByteBuffer._vptr_AbstractByteBuffer =
               (_func_int **)&local_e0.super_PENodeWrapper.super_ExeNodeWrapper.parentNode;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,local_128.d.ptr,local_128.d.size + (long)local_128.d.ptr);
          if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,1,8);
            }
          }
          AVar1._vptr_AbstractByteBuffer =
               local_e0.super_PENodeWrapper.super_ExeNodeWrapper.super_ExeElementWrapper.
               super_AbstractByteBuffer._vptr_AbstractByteBuffer;
          memcpy(&local_108,
                 local_e0.super_PENodeWrapper.super_ExeNodeWrapper.super_ExeElementWrapper.
                 super_AbstractByteBuffer._vptr_AbstractByteBuffer,__n);
          if ((ExeNodeWrapper **)AVar1._vptr_AbstractByteBuffer !=
              &local_e0.super_PENodeWrapper.super_ExeNodeWrapper.parentNode) {
            operator_delete(AVar1._vptr_AbstractByteBuffer,
                            (ulong)((long)&((local_e0.super_PENodeWrapper.super_ExeNodeWrapper.
                                            parentNode)->super_ExeElementWrapper).
                                           super_AbstractByteBuffer._vptr_AbstractByteBuffer + 1));
          }
        }
        if (0xfffffffe < r_size) {
          r_size = 0xffffffff;
        }
        local_108.PointerToRawData = (DWORD)bVar5;
        local_108.SizeOfRawData = (DWORD)r_size;
        uVar7 = 0xffffffff;
        if (v_size < 0xffffffff) {
          uVar7 = v_size;
        }
        local_108.VirtualAddress = (DWORD)local_110;
        local_108.Misc.PhysicalAddress = (DWORD)uVar7;
        SectionHdrWrapper::SectionHdrWrapper(&local_e0,this,&local_108);
        lVar8 = (**(code **)(*plVar6 + 0x140))(plVar6,&local_e0);
        if (lVar8 == 0) {
          pSVar9 = (SectionHdrWrapper *)0x0;
        }
        else {
          pSVar9 = (SectionHdrWrapper *)
                   __dynamic_cast(lVar8,&ExeNodeWrapper::typeinfo,&SectionHdrWrapper::typeinfo,0);
        }
        SectionHdrWrapper::~SectionHdrWrapper(&local_e0);
        WatchedLocker::~WatchedLocker((WatchedLocker *)&stack0xffffffffffffff98);
        return pSVar9;
      }
      pSVar9 = (SectionHdrWrapper *)&stack0xffffffffffffff98;
      goto LAB_00125a31;
    }
    Logger::append(D_ERROR,"Can not change OptHdr!");
    Logger::append(D_ERROR,"Failed to change virtual size to: %X",lVar8);
  }
  pSVar9 = &local_e0;
LAB_00125a31:
  WatchedLocker::~WatchedLocker((WatchedLocker *)pSVar9);
  return (SectionHdrWrapper *)0x0;
}

Assistant:

SectionHdrWrapper* PEFile::addNewSection(QString name, bufsize_t r_size, bufsize_t v_size)
{
    if (!r_size && !v_size) return nullptr; //nothing to add
    
    bufsize_t newSize = 0;
    bufsize_t roundedRawEnd = 0;
    bufsize_t roundedVirtualEnd = 0;
    SectionHdrWrapper* secHdrWr = nullptr;
    { //scope0
        WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
        if (!_canAddNewSection()) {
            return nullptr;
        }

        if (!v_size) {
            v_size = r_size;
        }
        roundedRawEnd = buf_util::roundupToUnit(getMappedSize(Executable::RAW), getAlignment(Executable::RAW));
        roundedVirtualEnd = buf_util::roundupToUnit(getMappedSize(Executable::RVA), getAlignment(Executable::RVA));
        newSize = roundedRawEnd + r_size;
        const bufsize_t newVirtualSize = roundedVirtualEnd + v_size;
        if (setVirtualSize(newVirtualSize) == false) {
            Logger::append(Logger::D_ERROR, "Failed to change virtual size to: %X", newVirtualSize);
            return nullptr;
        }
    } //scope0
    
    // the PE file is resized and rewrapped:
    if (resize(newSize) == false) {
        Logger::append(Logger::D_ERROR, "Failed to resize");
        return nullptr;
    }
    
    { //scope1
        WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
        // fetch again after resize:
        ExeNodeWrapper* sec = dynamic_cast<ExeNodeWrapper*>(getWrapper(PEFile::WR_SECTIONS));
        if (!sec) {
            return nullptr;
        }

        IMAGE_SECTION_HEADER secHdr;
        ::memset(&secHdr, 0, sizeof(IMAGE_SECTION_HEADER));

        //name copy:
        const size_t nameLen = name.length();
        const size_t bufSize = sizeof(secHdr.Name);
        const size_t copySize = (nameLen < bufSize) ? nameLen : bufSize;
        if (copySize) {
            ::memcpy(secHdr.Name, name.toStdString().c_str(), copySize);
        }
        secHdr.PointerToRawData = static_cast<DWORD>(roundedRawEnd);
        secHdr.VirtualAddress = static_cast<DWORD>(roundedVirtualEnd);
        secHdr.SizeOfRawData = MASK_TO_DWORD(r_size);
        secHdr.Misc.VirtualSize = MASK_TO_DWORD(v_size);

        SectionHdrWrapper wr(this, &secHdr);
        secHdrWr = dynamic_cast<SectionHdrWrapper*>(sec->addEntry(&wr));
    } //!scope1
    return secHdrWr;
}